

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoHelperLinux.cpp
# Opt level: O2

string * __thiscall
license::CryptoHelperLinux::Opensslb64Encode_abi_cxx11_
          (string *__return_storage_ptr__,CryptoHelperLinux *this,size_t slen,uchar *signature)

{
  BIO_METHOD *pBVar1;
  BIO *append;
  BIO *pBVar2;
  char *charBuf;
  
  pBVar1 = BIO_s_mem();
  append = BIO_new(pBVar1);
  pBVar1 = BIO_f_base64();
  pBVar2 = BIO_new(pBVar1);
  pBVar2 = BIO_push(pBVar2,append);
  BIO_set_flags(pBVar2,0x100);
  BIO_write(pBVar2,signature,(int)slen);
  BIO_ctrl(pBVar2,0xb,0,(void *)0x0);
  BIO_ctrl(append,3,0,&charBuf);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)charBuf);
  BIO_free_all(pBVar2);
  return __return_storage_ptr__;
}

Assistant:

const string CryptoHelperLinux::Opensslb64Encode(size_t slen,
		unsigned char* signature) const {
	/*
	 FILE*  stream = fmemopen(*buffer, encodedSize+1, "w");
	 */
	//bio = BIO_new_fp(stdout, BIO_NOCLOSE);
	/*int encodedSize = 4 * ceil(slen / 3);
	 char* buffer = (char*) (malloc(encodedSize + 1));
	 memset(buffer,0,encodedSize+1);*/
	BIO* mem_bio = BIO_new(BIO_s_mem());
	BIO* b64 = BIO_new(BIO_f_base64());
	BIO* bio1 = BIO_push(b64, mem_bio);
	BIO_set_flags(bio1, BIO_FLAGS_BASE64_NO_NL);
	BIO_write(bio1, signature, slen);
	BIO_flush(bio1);
	char* charBuf;
	int sz = BIO_get_mem_data(mem_bio, &charBuf);
	string signatureStr;
	signatureStr.assign(charBuf, sz);
	BIO_free_all(bio1);
	return signatureStr;
}